

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaCompressorSimd.cpp
# Opt level: O0

void anon_unknown.dwarf_e2799::compareBufferRelative
               (SimdAlignedBuffer64f *src,SimdAlignedBuffer64f *dst,float relErrThresh,
               float absErrThresh)

{
  ostream *poVar1;
  void *pvVar2;
  long *in_RSI;
  long *in_RDI;
  float in_XMM0_Da;
  double dVar3;
  double dVar4;
  SimdAlignedBuffer64f *buffer;
  float in_XMM1_Da;
  double relDiff;
  double diff;
  int i;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    if (0x3f < local_1c) {
      return;
    }
    dVar3 = std::fabs((double)(ulong)(uint)(*(float *)(*in_RDI + (long)local_1c * 4) -
                                           *(float *)(*in_RSI + (long)local_1c * 4)));
    dVar3 = (double)SUB84(dVar3,0);
    dVar4 = std::fabs((double)(ulong)*(uint *)(*in_RDI + (long)local_1c * 4));
    buffer = (SimdAlignedBuffer64f *)(dVar3 / (double)SUB84(dVar4,0));
    if (((double)in_XMM0_Da < (double)buffer) && ((double)in_XMM1_Da < dVar3)) break;
    local_1c = local_1c + 1;
  }
  std::ostream::operator<<(&std::cout,std::scientific);
  poVar1 = std::operator<<((ostream *)&std::cout,"Error exceeded threshold on element ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,local_1c);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout," diff: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
  poVar1 = std::operator<<(poVar1," relErr: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::fixed);
  poVar1 = (ostream *)std::ostream::operator<<(pvVar2,(double)buffer * 100.0);
  poVar1 = std::operator<<(poVar1," %");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Goal (src): ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::scientific);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  dumpBuffer(buffer);
  poVar1 = std::operator<<((ostream *)&std::cout,"Test (dst): ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  dumpBuffer(buffer);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDwaCompressorSimd.cpp"
                ,0x71,
                "void (anonymous namespace)::compareBufferRelative(const SimdAlignedBuffer64f &, const SimdAlignedBuffer64f &, const float, const float)"
               );
}

Assistant:

void
compareBufferRelative (const SimdAlignedBuffer64f &src,
                       const SimdAlignedBuffer64f &dst,
                       const float                 relErrThresh,
                       const float                 absErrThresh)
{
    for (int i=0; i<64; ++i)
    {
        double diff    = fabs(src._buffer[i] - dst._buffer[i]);
        double relDiff = diff / fabs(src._buffer[i]);

        if (relDiff > relErrThresh && diff > absErrThresh)
        {
            cout << scientific;
            cout << "Error exceeded threshold on element "  << i << endl;
            cout << " diff: " << diff << " relErr: " << fixed << 100.0*relDiff << " %" << endl;
            cout << "Goal (src): " << scientific << endl;
            dumpBuffer(src);
            cout << "Test (dst): " << endl;
            dumpBuffer(dst);

            assert(false);
        }
    }
}